

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

void testTranslationRotationMatrix<double>(M44d *mat)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint __line;
  int iVar6;
  ostream *s;
  char *__assertion;
  long lVar7;
  bool bVar8;
  vector<double,_std::allocator<double>_> weights;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> to;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> from;
  Vec3<double> local_1b8;
  V3d b2;
  V3d b1;
  Vec3<double> local_158;
  M44d m1;
  M44d m2;
  
  s = std::operator<<((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ");
  Imath_3_2::operator<<(s,mat);
  if (testTranslationRotationMatrix<double>(Imath_3_2::Matrix44<double>const&)::rand == '\0') {
    iVar6 = __cxa_guard_acquire(&testTranslationRotationMatrix<double>(Imath_3_2::Matrix44<double>const&)
                                 ::rand);
    if (iVar6 != 0) {
      testTranslationRotationMatrix<double>::rand._state[0] = 0xee01;
      testTranslationRotationMatrix<double>::rand._state[1] = 0xdfad;
      testTranslationRotationMatrix<double>::rand._state[2] = 0xee01;
      __cxa_guard_release(&testTranslationRotationMatrix<double>(Imath_3_2::Matrix44<double>const&)
                           ::rand);
    }
  }
  from.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  from.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  from.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::reserve(&from,7);
  to.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  to.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  to.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = 7;
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::reserve(&to,7);
  while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
    dVar2 = (double)Imath_3_2::erand48(testTranslationRotationMatrix<double>::rand._state);
    dVar3 = (double)Imath_3_2::erand48(testTranslationRotationMatrix<double>::rand._state);
    m1.x[0][2] = (double)Imath_3_2::erand48(testTranslationRotationMatrix<double>::rand._state);
    m1.x[0][0] = dVar2;
    m1.x[0][1] = dVar3;
    Imath_3_2::operator*((Vec3<double> *)&m1,mat);
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)m1.x[0][0];
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)m1.x[0][1];
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)m1.x[0][2];
    std::vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>>::
    emplace_back<Imath_3_2::Vec3<double>>
              ((vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>> *)&from,
               (Vec3<double> *)&weights);
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)m2.x[0][0];
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)m2.x[0][1];
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)m2.x[0][2];
    std::vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>>::
    emplace_back<Imath_3_2::Vec3<double>>
              ((vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>> *)&to,
               (Vec3<double> *)&weights);
  }
  m1.x[0][0] = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&weights,7,(value_type_conflict3 *)&m1,(allocator_type *)&m2);
  Imath_3_2::procrustesRotationAndTranslation<double>
            ((Vec3 *)&m1,
             (Vec3 *)from.
                     super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             &(to.
               super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->x,
             (ulong)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,true);
  Imath_3_2::procrustesRotationAndTranslation<double>
            ((Vec3 *)&m2,
             (Vec3 *)from.
                     super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (ulong)to.
                    super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,true);
  lVar7 = 0x10;
  while( true ) {
    if (lVar7 == 0xb8) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&weights.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
      ~_Vector_base(&to.
                     super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                   );
      std::_Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
      ~_Vector_base(&from.
                     super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                   );
      return;
    }
    pdVar1 = (double *)
             ((long)from.
                    super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x10);
    local_158.x = *pdVar1;
    local_158.y = pdVar1[1];
    local_158.z = *(double *)
                   ((long)&(from.
                            super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x + lVar7);
    pdVar1 = (double *)
             ((long)to.
                    super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x10);
    dVar4 = *pdVar1;
    dVar5 = pdVar1[1];
    dVar2 = *(double *)
             ((long)&(to.
                      super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->x + lVar7);
    Imath_3_2::operator*(&local_158,&m1);
    Imath_3_2::operator*(&local_158,&m2);
    local_1b8.z = dVar2 - b1.z;
    local_1b8.x = dVar4 - b1.x;
    local_1b8.y = dVar5 - b1.y;
    dVar3 = Imath_3_2::Vec3<double>::length(&local_1b8);
    if (1e-08 <= dVar3) break;
    local_1b8.z = dVar2 - b2.z;
    local_1b8.x = dVar4 - b2.x;
    local_1b8.y = dVar5 - b2.y;
    dVar2 = Imath_3_2::Vec3<double>::length(&local_1b8);
    if (1e-08 <= dVar2) {
      __assertion = "(b - b2).length () < eps";
      __line = 0x3c;
      goto LAB_0013f7e4;
    }
    lVar7 = lVar7 + 0x18;
  }
  __assertion = "(b - b1).length () < eps";
  __line = 0x3b;
LAB_0013f7e4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                ,__line,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = double]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t           numPoints = 7;
    std::vector<Vec> from;
    from.reserve (numPoints);
    std::vector<Vec> to;
    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (
            rand.nextf (), rand.nextf (), rand.nextf ());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec (a));
        to.push_back (Vec (b));
    }

    std::vector<T>                       weights (numPoints, T (1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (
        &from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 =
        procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof (T) == 8 ? T(1e-8) : T(1e-4);
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a  = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b  = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length () < eps);
        assert ((b - b2).length () < eps);
    }
    std::cout << "  OK\n";
}